

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

void P_RemoveThing(AActor *actor)

{
  _func_int **pp_Var1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  bool bVar5;
  PClass *pPVar4;
  
  pPVar2 = AInventory::RegistrationInfo.MyClass;
  if ((actor->player != (player_t *)0x0) && (actor->player->mo == (APlayerPawn *)actor)) {
    return;
  }
  pPVar4 = (actor->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar3 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
    pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
    (actor->super_DThinker).super_DObject.Class = pPVar4;
  }
  bVar5 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar2 && bVar5) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar5 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar2) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if ((bVar5) &&
     (pp_Var1 = actor[1].super_DThinker.super_DObject._vptr_DObject, pp_Var1 != (_func_int **)0x0))
  {
    if (((ulong)pp_Var1[4] & 0x20) == 0) {
      return;
    }
    actor[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
  }
  AActor::ClearCounters(actor);
  (*(actor->super_DThinker).super_DObject._vptr_DObject[4])(actor);
  return;
}

Assistant:

void P_RemoveThing(AActor * actor)
{
	// Don't remove live players.
	if (actor->player == NULL || actor != actor->player->mo)
	{
		// Don't also remove owned inventory items
		if (actor->IsKindOf(RUNTIME_CLASS(AInventory)) && static_cast<AInventory*>(actor)->Owner != NULL) return;

		// be friendly to the level statistics. ;)
		actor->ClearCounters();
		actor->Destroy ();
	}

}